

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# student_t_dist.hpp
# Opt level: O0

result_type_conflict3 * __thiscall
trng::student_t_dist<long_double>::icdf_(student_t_dist<long_double> *this,result_type_conflict3 x)

{
  int iVar1;
  result_type_conflict3 *extraout_RAX;
  param_type *in_RDI;
  double __x;
  unkbyte10 in_stack_00000008;
  result_type_conflict3 t;
  undefined4 in_stack_ffffffffffffffd4;
  undefined2 in_stack_ffffffffffffffd8;
  undefined2 in_stack_ffffffffffffffe0;
  undefined6 in_stack_ffffffffffffffe2;
  undefined2 uVar2;
  undefined2 uVar3;
  undefined6 in_stack_fffffffffffffff2;
  undefined2 uVar4;
  
  uVar4 = SUB82(in_RDI,0);
  uVar2 = (undefined2)in_stack_00000008;
  uVar3 = (undefined2)((unkuint10)in_stack_00000008 >> 0x40);
  param_type::nu(in_RDI);
  iVar1 = param_type::nu(in_RDI);
  math::inv_Beta_I((longdouble)CONCAT28(uVar4,CONCAT62(in_stack_fffffffffffffff2,uVar3)),
                   (longdouble)
                   CONCAT28(uVar2,CONCAT62(in_stack_ffffffffffffffe2,in_stack_ffffffffffffffe0)),
                   (longdouble)
                   CONCAT28(in_stack_ffffffffffffffd8,CONCAT44(in_stack_ffffffffffffffd4,iVar1)));
  param_type::nu(in_RDI);
  std::sqrt(__x);
  return extraout_RAX;
}

Assistant:

icdf_(result_type x) const {
      const result_type t{
          math::inv_Beta_I(x, P.nu() / result_type(2), P.nu() / result_type(2))};
      return math::sqrt(P.nu() / (t * (1 - t))) * (t - result_type(1) / result_type(2));
    }